

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O1

Status leveldb::WriteBatchInternal::InsertInto(WriteBatch *b,MemTable *memtable)

{
  uint8_t *buffer;
  MemTableInserter inserter;
  
  WriteBatch::Iterate(b,(Handler *)memtable);
  return (Status)(char *)b;
}

Assistant:

Status WriteBatchInternal::InsertInto(const WriteBatch* b, MemTable* memtable) {
  MemTableInserter inserter;
  inserter.sequence_ = WriteBatchInternal::Sequence(b);
  inserter.mem_ = memtable;
  return b->Iterate(&inserter);
}